

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O0

void Io_NtkWritePiPoNodes(FILE *pFile,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  char *pcVar3;
  int local_2c;
  int i;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pTerm;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  for (local_2c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkPi(pNtk,local_2c);
    pAVar2 = Abc_ObjFanout0(pAVar2);
    pcVar3 = Abc_ObjName(pAVar2);
    fprintf((FILE *)pFile,"i%s_input\t",pcVar3);
    fprintf((FILE *)pFile,"terminal ");
    fprintf((FILE *)pFile," %d %d\n",1);
  }
  for (local_2c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_2c);
    pAVar2 = Abc_ObjFanin0(pAVar2);
    pcVar3 = Abc_ObjName(pAVar2);
    fprintf((FILE *)pFile,"o%s_output\t",pcVar3);
    fprintf((FILE *)pFile,"terminal ");
    fprintf((FILE *)pFile," %d %d\n",1);
  }
  return;
}

Assistant:

void Io_NtkWritePiPoNodes( FILE * pFile, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pTerm, * pNet;
    int i;

    Abc_NtkForEachPi( pNtk, pTerm, i )
    {
        pNet = Abc_ObjFanout0(pTerm);
    fprintf( pFile, "i%s_input\t", Abc_ObjName(pNet) ); 
    fprintf( pFile, "terminal ");
    fprintf( pFile, " %d %d\n", termWidth, termHeight );
    }
    
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
    pNet = Abc_ObjFanin0(pTerm);
    fprintf( pFile, "o%s_output\t", Abc_ObjName(pNet) ); 
    fprintf( pFile, "terminal ");
    fprintf( pFile, " %d %d\n", termWidth, termHeight );
    }
}